

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O1

Mesh * vera::planeMesh(Mesh *__return_storage_ptr__,float _width,float _height,int _columns,
                      int _rows,DrawMode _drawMode)

{
  DrawMode DVar1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  int iVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t _i;
  bool bVar9;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aVar10;
  vec2 texcoord;
  vec3 vert;
  vec3 normal;
  uint32_t local_88;
  undefined8 local_50;
  vec3 local_48;
  vec3 local_3c;
  
  Mesh::Mesh(__return_storage_ptr__);
  DVar1 = TRIANGLES;
  if (0xfffffffd < _drawMode - TRIANGLE_FAN) {
    DVar1 = _drawMode;
  }
  uVar7 = _columns + 1;
  __return_storage_ptr__->m_drawMode = DVar1;
  local_48.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_48.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  local_48.field_2.z = 0.0;
  local_3c.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_3c.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  local_3c.field_2.z = 1.0;
  local_50._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  local_50._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  if (_rows + 1 != 0) {
    iVar6 = 0;
    do {
      if (uVar7 != 0) {
        aVar10.y = 1.0 - (float)iVar6 / ((float)(_rows + 1) + -1.0);
        uVar2 = 0;
        do {
          local_50._0_4_ = (float)(int)uVar2 / ((float)(int)uVar7 + -1.0);
          local_50._4_4_ = aVar10.y;
          local_48.field_1.y = _height * -0.5 - (aVar10.y + -1.0) * _height;
          local_48.field_0.x = local_50._0_4_ * _width + _width * -0.5;
          Mesh::addVertex(__return_storage_ptr__,&local_48);
          Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_50);
          Mesh::addNormal(__return_storage_ptr__,&local_3c);
          uVar2 = uVar2 + 1;
        } while (uVar7 != uVar2);
      }
      bVar9 = iVar6 != _rows;
      iVar6 = iVar6 + 1;
    } while (bVar9);
  }
  if (DVar1 == TRIANGLE_STRIP) {
    if (0 < _rows) {
      uVar2 = _columns * 2 + 1;
      iVar6 = -1;
      local_88 = 0;
      uVar3 = 0;
      do {
        if ((uVar3 & 1) == 0) {
          uVar8 = local_88;
          uVar5 = uVar7;
          if (-1 < _columns) {
            do {
              Mesh::addIndex(__return_storage_ptr__,uVar8);
              Mesh::addIndex(__return_storage_ptr__,uVar7 + uVar8);
              uVar5 = uVar5 - 1;
              uVar8 = uVar8 + 1;
            } while (uVar5 != 0);
          }
        }
        else {
          uVar8 = uVar2;
          iVar4 = _columns;
          if (0 < _columns) {
            do {
              Mesh::addIndex(__return_storage_ptr__,uVar8);
              Mesh::addIndex(__return_storage_ptr__,iVar4 + iVar6);
              uVar8 = uVar8 - 1;
              bVar9 = 1 < iVar4;
              iVar4 = iVar4 + -1;
            } while (bVar9);
          }
        }
        uVar3 = uVar3 + 1;
        uVar2 = uVar2 + uVar7;
        iVar6 = iVar6 + uVar7;
        local_88 = local_88 + uVar7;
      } while (uVar3 != _rows);
    }
    if ((_rows & 1U) == 0) {
      Mesh::addIndex(__return_storage_ptr__,
                     (int)((ulong)((long)(__return_storage_ptr__->m_vertices).
                                         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(__return_storage_ptr__->m_vertices).
                                        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                     -0x55555555 - uVar7);
    }
  }
  else if (0 < _rows) {
    iVar6 = 0;
    uVar8 = 1;
    uVar2 = uVar7;
    do {
      uVar5 = uVar2;
      _i = uVar8;
      iVar4 = _columns;
      if (0 < _columns) {
        do {
          Mesh::addIndex(__return_storage_ptr__,_i - 1);
          Mesh::addIndex(__return_storage_ptr__,_i);
          Mesh::addIndex(__return_storage_ptr__,uVar5);
          Mesh::addIndex(__return_storage_ptr__,_i);
          Mesh::addIndex(__return_storage_ptr__,uVar5 + 1);
          Mesh::addIndex(__return_storage_ptr__,uVar5);
          _i = _i + 1;
          iVar4 = iVar4 + -1;
          uVar5 = uVar5 + 1;
        } while (iVar4 != 0);
      }
      iVar6 = iVar6 + 1;
      uVar2 = uVar2 + uVar7;
      uVar8 = uVar8 + uVar7;
    } while (iVar6 != _rows);
  }
  return __return_storage_ptr__;
}

Assistant:

Mesh planeMesh(float _width, float _height, int _columns, int _rows, DrawMode _drawMode) {
    Mesh mesh;

    if (_drawMode != TRIANGLE_STRIP && _drawMode != TRIANGLES)
        _drawMode = TRIANGLES;

    _columns++;
    _rows++;

    mesh.setDrawMode(_drawMode);

    glm::vec3 vert(0.0f, 0.0f, 0.0f);
    glm::vec3 normal(0.0f, 0.0f, 1.0f); // always facing forward //
    glm::vec2 texcoord(0.0f, 0.0f);

    // the origin of the plane is at the center //
    float halfW = _width  * 0.5f;
    float halfH = _height * 0.5f;
    
    // add the vertexes //
    for (int iy = 0; iy != _rows; iy++) {
        for (int ix = 0; ix != _columns; ix++) {

            // normalized tex coords //
            texcoord.x =       ((float)ix/((float)_columns-1));
            texcoord.y = 1.f - ((float)iy/((float)_rows-1));

            vert.x = texcoord.x * _width - halfW;
            vert.y = -(texcoord.y-1) * _height - halfH;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    if (_drawMode == TRIANGLE_STRIP) {
        for (int y = 0; y < _rows-1; y++) {
            // even _rows //
            if ((y&1)==0) {
                for (int x = 0; x < _columns; x++) {
                    mesh.addIndex( (y) * _columns + x );
                    mesh.addIndex( (y+1) * _columns + x);
                }
            }
            else {
                for (int x = _columns-1; x >0; x--) {
                    mesh.addIndex( (y+1) * _columns + x );
                    mesh.addIndex( y * _columns + x-1 );
                }
            }
        }

        if (_rows%2 != 0) mesh.addIndex(mesh.getVerticesTotal() - _columns);
    }
    else {

        // Triangles //
        for (int y = 0; y < _rows - 1; y++) {
            for (int x = 0; x < _columns - 1; x++) {
                // first triangle //
                mesh.addIndex((y) *_columns + x);
                mesh.addIndex((y) *_columns + x + 1);
                mesh.addIndex((y + 1) *_columns + x);

                // second triangle //
                mesh.addIndex((y) * _columns + x+1);
                mesh.addIndex((y + 1) *_columns + x+1);
                mesh.addIndex((y + 1) *_columns + x);
            }
        }
    }

    return mesh;
}